

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O0

void tcp_fini(void *arg)

{
  nni_tcp_conn *c;
  void *arg_local;
  
  tcp_stop(arg);
  nni_posix_pfd_fini((nni_posix_pfd *)((long)arg + 0x38));
  nni_mtx_fini((nni_mtx *)((long)arg + 0xa8));
  if (*(long *)((long)arg + 0xd8) != 0) {
    nni_posix_tcp_dialer_rele(*(nni_tcp_dialer **)((long)arg + 0xd8));
  }
  nni_free(arg,0xe8);
  return;
}

Assistant:

static void
tcp_fini(void *arg)
{
	nni_tcp_conn *c = arg;
	tcp_stop(c);
	nni_posix_pfd_fini(&c->pfd);
	nni_mtx_fini(&c->mtx);

	if (c->dialer != NULL) {
		nni_posix_tcp_dialer_rele(c->dialer);
	}
	NNI_FREE_STRUCT(c);
}